

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O0

void nn_sws_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  uint16_t uVar1;
  int iVar2;
  uint64_t uVar3;
  uint8_t *puVar4;
  nn_sws *local_38;
  int rc;
  nn_sws *sws;
  void *srcptr_local;
  int type_local;
  int src_local;
  nn_fsm *self_local;
  
  local_38 = (nn_sws *)self;
  if (self == (nn_fsm *)0x0) {
    local_38 = (nn_sws *)0x0;
  }
  switch(local_38->state) {
  case 1:
    if (src != -2) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)(uint)local_38->state,(ulong)(uint)src,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/sws.c"
              ,0x336);
      fflush(_stderr);
      nn_err_abort();
    }
    if (type != -2) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)(uint)local_38->state,0xfffffffe,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/sws.c"
              ,0x332);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_ws_handshake_start
              (&local_38->handshaker,local_38->usock,&local_38->pipebase,local_38->mode,
               local_38->resource,local_38->remote_host);
    local_38->state = 2;
    break;
  case 2:
    if (src != 2) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)(uint)local_38->state,(ulong)(uint)src,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/sws.c"
              ,0x357);
      fflush(_stderr);
      nn_err_abort();
    }
    if (type == 1) {
      nn_ws_handshake_stop(&local_38->handshaker);
      local_38->state = 3;
    }
    else {
      if (type != 2) {
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)(uint)local_38->state,2,(ulong)(uint)type,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/sws.c"
                ,0x353);
        fflush(_stderr);
        nn_err_abort();
      }
      local_38->state = 7;
      nn_fsm_raise(&local_38->fsm,&local_38->done,2);
    }
    break;
  case 3:
    if (src != 2) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)(uint)local_38->state,(ulong)(uint)src,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/sws.c"
              ,0x37a);
      fflush(_stderr);
      nn_err_abort();
    }
    if (type != 3) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)(uint)local_38->state,2,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/sws.c"
              ,0x376);
      fflush(_stderr);
      nn_err_abort();
    }
    iVar2 = nn_pipebase_start(&local_38->pipebase);
    if (iVar2 < 0) {
      local_38->state = 7;
      nn_fsm_raise(&local_38->fsm,&local_38->done,1);
    }
    else {
      nn_sws_recv_hdr(local_38);
      local_38->outstate = 1;
      local_38->state = 4;
    }
    break;
  case 4:
    if (src != 1) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)(uint)local_38->state,(ulong)(uint)src,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/sws.c"
              ,0x57c);
      fflush(_stderr);
      nn_err_abort();
    }
    switch(type) {
    case 3:
      if (local_38->outstate != 2) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sws->outstate == NN_SWS_OUTSTATE_SENDING",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/sws.c"
                ,0x388);
        fflush(_stderr);
        nn_err_abort();
      }
      local_38->outstate = 1;
      nn_msg_term(&local_38->outmsg);
      nn_msg_init(&local_38->outmsg,0);
      nn_pipebase_sent(&local_38->pipebase);
      break;
    case 4:
      iVar2 = local_38->instate;
      if (iVar2 == 1) {
        if ((((local_38->inhdr[0] & 0x40) == 0) && ((local_38->inhdr[0] & 0x20) == 0)) &&
           ((local_38->inhdr[0] & 0x10) == 0)) {
          local_38->is_final_frame = local_38->inhdr[0] & 0xffffff80;
          local_38->masked = local_38->inhdr[1] & 0x80;
          if (local_38->mode == 1) {
            if (local_38->masked != '\0') {
              nn_sws_fail_conn(local_38,0x3ea,"Client expects MASK bit to be unset.");
              return;
            }
            local_38->ext_hdr_len = 0;
          }
          else {
            if (local_38->mode != 2) {
              fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/sws.c"
                      ,0x3be);
              fflush(_stderr);
              nn_err_abort();
            }
            if (local_38->masked == '\0') {
              nn_sws_fail_conn(local_38,0x3ea,"Server expects MASK bit to be set.");
              return;
            }
            local_38->ext_hdr_len = 4;
          }
          local_38->opcode = local_38->inhdr[0] & 0xf;
          local_38->payload_ctl = local_38->inhdr[1] & 0x7f;
          if ((local_38->continuing == 0) && (local_38->opcode == '\0')) {
            nn_sws_fail_conn(local_38,0x3ea,"No message to continue.");
          }
          else {
            if (local_38->continuing == 0) {
              local_38->inmsg_hdr = local_38->inhdr[0] | 0x80;
            }
            if (local_38->payload_ctl < 0x7e) {
              local_38->ext_hdr_len = local_38->ext_hdr_len;
            }
            else if (local_38->payload_ctl == '~') {
              local_38->ext_hdr_len = local_38->ext_hdr_len + 2;
            }
            else {
              if (local_38->payload_ctl != '\x7f') {
                fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/sws.c"
                        ,0x3e0);
                fflush(_stderr);
                nn_err_abort();
              }
              local_38->ext_hdr_len = local_38->ext_hdr_len + 8;
            }
            switch(local_38->opcode) {
            case '\0':
              local_38->is_control_frame = 0;
              local_38->continuing = (uint)((local_38->is_final_frame != 0 ^ 0xffU) & 1);
              if ((local_38->ext_hdr_len == 0) && (local_38->payload_ctl == '\0')) {
                if (local_38->mode != 1) {
                  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sws->mode == NN_WS_CLIENT",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/sws.c"
                          ,0x415);
                  fflush(_stderr);
                  nn_err_abort();
                }
                local_38->inmsg_current_chunk_len = 0;
                if (local_38->continuing != 0) {
                  nn_sws_recv_hdr(local_38);
                  return;
                }
                local_38->instate = 4;
                nn_pipebase_received(&local_38->pipebase);
                return;
              }
              break;
            case '\x01':
            case '\x02':
              local_38->is_control_frame = 0;
              if (local_38->continuing != 0) {
                nn_sws_fail_conn(local_38,0x3ea,"Expected continuation frame opcode.");
                return;
              }
              if (local_38->is_final_frame == 0) {
                local_38->continuing = 1;
              }
              if ((local_38->ext_hdr_len == 0) && (local_38->payload_ctl == '\0')) {
                if (local_38->mode != 1) {
                  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sws->mode == NN_WS_CLIENT",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/sws.c"
                          ,0x3f8);
                  fflush(_stderr);
                  nn_err_abort();
                }
                local_38->inmsg_current_chunk_len = 0;
                if (local_38->continuing != 0) {
                  nn_sws_recv_hdr(local_38);
                  return;
                }
                local_38->instate = 4;
                nn_pipebase_received(&local_38->pipebase);
                return;
              }
              break;
            default:
              nn_sws_fail_conn(local_38,0x3ea,"Invalid opcode.");
              return;
            case '\b':
              local_38->is_control_frame = 1;
              if (local_38->is_final_frame == 0) {
                nn_sws_fail_conn(local_38,0x3ea,"Cannot fragment control message (FIN=0).");
                return;
              }
              if (0x7d < local_38->payload_ctl) {
                nn_sws_fail_conn(local_38,0x3ea,"Control frame payload exceeds allowable length.");
                return;
              }
              if (local_38->payload_ctl == '\x01') {
                nn_sws_fail_conn(local_38,0x3ea,"Expected 2byte close code.");
                return;
              }
              if ((local_38->ext_hdr_len == 0) && (local_38->payload_ctl == '\0')) {
                local_38->inmsg_current_chunk_len = 0;
                local_38->instate = 5;
                nn_pipebase_received(&local_38->pipebase);
                return;
              }
              break;
            case '\t':
              local_38->is_control_frame = 1;
              local_38->pings_received = local_38->pings_received + 1;
              if (0x7d < local_38->payload_ctl) {
                nn_sws_fail_conn(local_38,0x3ea,"Control frame payload exceeds allowable length.");
                return;
              }
              if (local_38->is_final_frame == 0) {
                nn_sws_fail_conn(local_38,0x3ea,"Cannot fragment control message (FIN=0).");
                return;
              }
              if ((local_38->ext_hdr_len == 0) && (local_38->payload_ctl == '\0')) {
                local_38->inmsg_current_chunk_len = 0;
                local_38->instate = 5;
                nn_pipebase_received(&local_38->pipebase);
                return;
              }
              break;
            case '\n':
              local_38->is_control_frame = 1;
              local_38->pongs_received = local_38->pongs_received + 1;
              if (0x7d < local_38->payload_ctl) {
                nn_sws_fail_conn(local_38,0x3ea,"Control frame payload exceeds allowable length.");
                return;
              }
              if (local_38->is_final_frame == 0) {
                nn_sws_fail_conn(local_38,0x3ea,"Cannot fragment control message (FIN=0).");
                return;
              }
              if ((local_38->ext_hdr_len == 0) && (local_38->payload_ctl == '\0')) {
                local_38->inmsg_current_chunk_len = 0;
                local_38->instate = 5;
                nn_pipebase_received(&local_38->pipebase);
                return;
              }
            }
            if (local_38->ext_hdr_len == 0) {
              if (local_38->mode != 1) {
                fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sws->mode == NN_WS_CLIENT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/sws.c"
                        ,0x49d);
                fflush(_stderr);
                nn_err_abort();
              }
              if (0x7d < local_38->payload_ctl) {
                fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                        "sws->payload_ctl <= NN_SWS_PAYLOAD_MAX_LENGTH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/sws.c"
                        ,0x4a1);
                fflush(_stderr);
                nn_err_abort();
              }
              if (local_38->payload_ctl == '\0') {
                fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sws->payload_ctl > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/sws.c"
                        ,0x4a5);
                fflush(_stderr);
                nn_err_abort();
              }
              local_38->instate = 3;
              local_38->inmsg_current_chunk_len = (ulong)local_38->payload_ctl;
              if (local_38->is_control_frame == 0) {
                local_38->inmsg_chunks = local_38->inmsg_chunks + 1;
                local_38->inmsg_total_size =
                     local_38->inmsg_current_chunk_len + local_38->inmsg_total_size;
                puVar4 = (uint8_t *)
                         nn_msg_chunk_new(local_38->inmsg_current_chunk_len,&local_38->inmsg_array);
                local_38->inmsg_current_chunk_buf = puVar4;
              }
              else {
                local_38->inmsg_current_chunk_buf = local_38->inmsg_control;
              }
              nn_usock_recv(local_38->usock,local_38->inmsg_current_chunk_buf,
                            local_38->inmsg_current_chunk_len,(int *)0x0);
            }
            else {
              local_38->instate = 2;
              nn_usock_recv(local_38->usock,local_38->inhdr + 2,local_38->ext_hdr_len,(int *)0x0);
            }
          }
        }
        else {
          nn_sws_fail_conn(local_38,0x3ea,"RSV1, RSV2, and RSV3 must be unset.");
        }
      }
      else if (iVar2 == 2) {
        if (local_38->ext_hdr_len == 0) {
          fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sws->ext_hdr_len > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/sws.c"
                  ,0x4c9);
          fflush(_stderr);
          nn_err_abort();
        }
        if (local_38->payload_ctl < 0x7e) {
          local_38->inmsg_current_chunk_len = (ulong)local_38->payload_ctl;
          if (local_38->masked == '\0') {
            local_38->mask = (uint8_t *)0x0;
          }
          else {
            local_38->mask = local_38->inhdr + 2;
          }
        }
        else if (local_38->payload_ctl == '~') {
          uVar1 = nn_gets(local_38->inhdr + 2);
          local_38->inmsg_current_chunk_len = (ulong)uVar1;
          if (local_38->masked == '\0') {
            local_38->mask = (uint8_t *)0x0;
          }
          else {
            local_38->mask = local_38->inhdr + 4;
          }
        }
        else {
          if (local_38->payload_ctl != '\x7f') {
            nn_sws_fail_conn(local_38,0x3ea,"Invalid payload length.");
            return;
          }
          uVar3 = nn_getll(local_38->inhdr + 2);
          local_38->inmsg_current_chunk_len = uVar3;
          if (local_38->masked == '\0') {
            local_38->mask = (uint8_t *)0x0;
          }
          else {
            local_38->mask = local_38->inhdr + 10;
          }
        }
        if (local_38->inmsg_current_chunk_len == 0) {
          if (local_38->is_final_frame == 0) {
            nn_sws_recv_hdr(local_38);
          }
          else if (local_38->opcode == '\b') {
            nn_pipebase_stop(&local_38->pipebase);
            local_38->state = 5;
          }
          else {
            iVar2 = 4;
            if (local_38->is_control_frame != 0) {
              iVar2 = 5;
            }
            local_38->instate = iVar2;
            nn_pipebase_received(&local_38->pipebase);
          }
        }
        else {
          if (local_38->inmsg_current_chunk_len == 0) {
            fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sws->inmsg_current_chunk_len > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/sws.c"
                    ,0x50b);
            fflush(_stderr);
            nn_err_abort();
          }
          if (local_38->is_control_frame == 0) {
            local_38->inmsg_chunks = local_38->inmsg_chunks + 1;
            local_38->inmsg_total_size =
                 local_38->inmsg_current_chunk_len + local_38->inmsg_total_size;
            puVar4 = (uint8_t *)
                     nn_msg_chunk_new(local_38->inmsg_current_chunk_len,&local_38->inmsg_array);
            local_38->inmsg_current_chunk_buf = puVar4;
          }
          else {
            local_38->inmsg_current_chunk_buf = local_38->inmsg_control;
          }
          local_38->instate = 3;
          nn_usock_recv(local_38->usock,local_38->inmsg_current_chunk_buf,
                        local_38->inmsg_current_chunk_len,(int *)0x0);
        }
      }
      else {
        if (iVar2 != 3) {
          fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected socket instate",
                  (ulong)(uint)local_38->state,1,(ulong)(uint)type,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/sws.c"
                  ,0x567);
          fflush(_stderr);
          nn_err_abort();
        }
        if (local_38->masked != '\0') {
          nn_sws_mask_payload(local_38->inmsg_current_chunk_buf,local_38->inmsg_current_chunk_len,
                              local_38->mask,4,(int *)0x0);
        }
        switch(local_38->opcode) {
        case '\0':
          if ((local_38->inmsg_hdr & 0xf) == 1) {
            nn_sws_validate_utf8_chunk(local_38);
          }
          else if (local_38->is_final_frame == 0) {
            nn_sws_recv_hdr(local_38);
          }
          else {
            local_38->instate = 4;
            nn_pipebase_received(&local_38->pipebase);
          }
          break;
        case '\x01':
          nn_sws_validate_utf8_chunk(local_38);
          break;
        case '\x02':
          if (local_38->is_final_frame == 0) {
            nn_sws_recv_hdr(local_38);
          }
          else {
            local_38->instate = 4;
            nn_pipebase_received(&local_38->pipebase);
          }
          break;
        default:
          fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/sws.c"
                  ,0x561);
          fflush(_stderr);
          nn_err_abort();
        case '\b':
          if (local_38->inmsg_current_chunk_len < 2) {
            fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
                    "sws->inmsg_current_chunk_len >= NN_SWS_CLOSE_CODE_LEN",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/sws.c"
                    ,0x559);
            fflush(_stderr);
            nn_err_abort();
          }
          nn_pipebase_stop(&local_38->pipebase);
          local_38->state = 5;
          break;
        case '\t':
          local_38->instate = 5;
          nn_pipebase_received(&local_38->pipebase);
          break;
        case '\n':
          local_38->instate = 5;
          nn_pipebase_received(&local_38->pipebase);
        }
      }
      break;
    case 5:
      nn_pipebase_stop(&local_38->pipebase);
      local_38->state = 7;
      nn_fsm_raise(&local_38->fsm,&local_38->done,1);
      break;
    default:
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)(uint)local_38->state,1,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/sws.c"
              ,0x576);
      fflush(_stderr);
      nn_err_abort();
    case 8:
      nn_pipebase_stop(&local_38->pipebase);
      local_38->state = 6;
    }
    break;
  case 5:
    if (src != 1) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)(uint)local_38->state,(ulong)(uint)src,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/sws.c"
              ,0x59c);
      fflush(_stderr);
      nn_err_abort();
    }
    if (type == 3) {
      if (local_38->outstate != 2) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sws->outstate == NN_SWS_OUTSTATE_SENDING",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/sws.c"
                ,0x58b);
        fflush(_stderr);
        nn_err_abort();
      }
      local_38->outstate = 1;
      local_38->state = 7;
      nn_fsm_raise(&local_38->fsm,&local_38->done,2);
    }
    else if (type == 5) {
      local_38->state = 7;
      nn_fsm_raise(&local_38->fsm,&local_38->done,1);
    }
    else if (type != 8) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)(uint)local_38->state,1,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/sws.c"
              ,0x598);
      fflush(_stderr);
      nn_err_abort();
    }
    break;
  case 6:
    if (src != 1) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)(uint)local_38->state,(ulong)(uint)src,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/sws.c"
              ,0x5b2);
      fflush(_stderr);
      nn_err_abort();
    }
    if (type != 5) {
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)(uint)local_38->state,1,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/sws.c"
              ,0x5ae);
      fflush(_stderr);
      nn_err_abort();
    }
    local_38->state = 7;
    nn_fsm_raise(&local_38->fsm,&local_38->done,1);
    break;
  case 7:
    fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
            (ulong)(uint)local_38->state,(ulong)(uint)src,(ulong)(uint)type,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/sws.c"
            ,0x5bb);
    fflush(_stderr);
    nn_err_abort();
  default:
    fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
            (ulong)(uint)local_38->state,(ulong)(uint)src,(ulong)(uint)type,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/sws.c"
            ,0x5c1);
    fflush(_stderr);
    nn_err_abort();
  }
  return;
}

Assistant:

static void nn_sws_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_sws *sws;
    int rc;

    sws = nn_cont (self, struct nn_sws, fsm);

    switch (sws->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_SWS_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                nn_ws_handshake_start (&sws->handshaker, sws->usock,
                    &sws->pipebase, sws->mode, sws->resource, sws->remote_host);
                sws->state = NN_SWS_STATE_HANDSHAKE;
                return;
            default:
                nn_fsm_bad_action (sws->state, src, type);
            }

        default:
            nn_fsm_bad_source (sws->state, src, type);
        }

/******************************************************************************/
/*  HANDSHAKE state.                                                          */
/******************************************************************************/
    case NN_SWS_STATE_HANDSHAKE:
        switch (src) {

        case NN_SWS_SRC_HANDSHAKE:
            switch (type) {
            case NN_WS_HANDSHAKE_OK:

                /*  Before moving to the active state stop the handshake
                    state machine. */
                nn_ws_handshake_stop (&sws->handshaker);
                sws->state = NN_SWS_STATE_STOPPING_HANDSHAKE;
                return;

            case NN_WS_HANDSHAKE_ERROR:

                /* Raise the error and move directly to the DONE state.
                   ws_handshake object will be stopped later on. */
                sws->state = NN_SWS_STATE_DONE;
                nn_fsm_raise (&sws->fsm, &sws->done,
                    NN_SWS_RETURN_CLOSE_HANDSHAKE);
                return;

            default:
                nn_fsm_bad_action (sws->state, src, type);
            }

        default:
            nn_fsm_bad_source (sws->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_HANDSHAKE state.                                                 */
/******************************************************************************/
    case NN_SWS_STATE_STOPPING_HANDSHAKE:
        switch (src) {

        case NN_SWS_SRC_HANDSHAKE:
            switch (type) {
            case NN_WS_HANDSHAKE_STOPPED:

                 /*  Start the pipe. */
                 rc = nn_pipebase_start (&sws->pipebase);
                 if (nn_slow (rc < 0)) {
                    sws->state = NN_SWS_STATE_DONE;
                    nn_fsm_raise (&sws->fsm, &sws->done, NN_SWS_RETURN_ERROR);
                    return;
                 }

                 /*  Start receiving a message in asynchronous manner. */
                 nn_sws_recv_hdr (sws);

                 /*  Mark the pipe as available for sending. */
                 sws->outstate = NN_SWS_OUTSTATE_IDLE;

                 sws->state = NN_SWS_STATE_ACTIVE;
                 return;

            default:
                nn_fsm_bad_action (sws->state, src, type);
            }

        default:
            nn_fsm_bad_source (sws->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/******************************************************************************/
    case NN_SWS_STATE_ACTIVE:
        switch (src) {

        case NN_SWS_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SENT:

                /*  The message is now fully sent. */
                nn_assert (sws->outstate == NN_SWS_OUTSTATE_SENDING);
                sws->outstate = NN_SWS_OUTSTATE_IDLE;
                nn_msg_term (&sws->outmsg);
                nn_msg_init (&sws->outmsg, 0);
                nn_pipebase_sent (&sws->pipebase);
                return;

            case NN_USOCK_RECEIVED:

                switch (sws->instate) {
                case NN_SWS_INSTATE_RECV_HDR:

                    /*  Require RSV1, RSV2, and RSV3 bits to be unset for
                        x-nanomsg protocol as per RFC 6455 section 5.2. */
                    if (sws->inhdr [0] & NN_SWS_FRAME_BITMASK_RSV1 ||
                        sws->inhdr [0] & NN_SWS_FRAME_BITMASK_RSV2 ||
                        sws->inhdr [0] & NN_SWS_FRAME_BITMASK_RSV3) {
                        nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                            "RSV1, RSV2, and RSV3 must be unset.");
                        return;
                    }

                    sws->is_final_frame = sws->inhdr [0] &
                        NN_SWS_FRAME_BITMASK_FIN;
                    sws->masked = sws->inhdr [1] &
                        NN_SWS_FRAME_BITMASK_MASKED;

                    switch (sws->mode) {
                    case NN_WS_SERVER:
                        /*  Require mask bit to be set from client. */
                        if (sws->masked) {
                            /*  Continue receiving header for this frame. */
                            sws->ext_hdr_len = NN_SWS_FRAME_SIZE_MASK;
                            break;
                        }
                        else {
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Server expects MASK bit to be set.");
                            return;
                        }
                    case NN_WS_CLIENT:
                        /*  Require mask bit to be unset from server. */
                        if (sws->masked) {
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Client expects MASK bit to be unset.");
                            return;
                        }
                        else {
                            /*  Continue receiving header for this frame. */
                            sws->ext_hdr_len = 0;
                            break;
                        }
                    default:
                        /*  Only two modes of this endpoint are expected. */
                        nn_assert (0);
                        return;
                    }

                    sws->opcode = sws->inhdr [0] &
                        NN_SWS_FRAME_BITMASK_OPCODE;
                    sws->payload_ctl = sws->inhdr [1] &
                        NN_SWS_FRAME_BITMASK_LENGTH;

                    /*  Prevent unexpected continuation frame. */
                    if (!sws->continuing &&
                        sws->opcode == NN_WS_OPCODE_FRAGMENT) {
                        nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                            "No message to continue.");
                        return;
                    }

                    /*  Preserve initial message opcode and RSV bits in case
                        this is a fragmented message. */
                    if (!sws->continuing)
                        sws->inmsg_hdr = sws->inhdr [0] |
                        NN_SWS_FRAME_BITMASK_FIN;

                    if (sws->payload_ctl <= NN_SWS_PAYLOAD_MAX_LENGTH) {
                        sws->ext_hdr_len += NN_SWS_FRAME_SIZE_PAYLOAD_0;
                    }
                    else if (sws->payload_ctl == NN_SWS_PAYLOAD_FRAME_16) {
                        sws->ext_hdr_len += NN_SWS_FRAME_SIZE_PAYLOAD_16;
                    }
                    else if (sws->payload_ctl == NN_SWS_PAYLOAD_FRAME_63) {
                        sws->ext_hdr_len += NN_SWS_FRAME_SIZE_PAYLOAD_63;
                    }
                    else {
                        /*  Developer error parsing/handling length. */
                        nn_assert (0);
                        return;
                    }

                    switch (sws->opcode) {

                    case NN_WS_OPCODE_TEXT:
                        /*  Fall thru; TEXT and BINARY handled alike. */
                    case NN_WS_OPCODE_BINARY:

                        sws->is_control_frame = 0;

                        if (sws->continuing) {
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Expected continuation frame opcode.");
                            return;
                        }

                        if (!sws->is_final_frame)
                            sws->continuing = 1;

                        if (sws->ext_hdr_len == 0 && sws->payload_ctl == 0) {
                            /*  Only a remote server could send a 2-byte msg;
                                sanity-check that this endpoint is a client. */
                            nn_assert (sws->mode == NN_WS_CLIENT);

                            sws->inmsg_current_chunk_len = 0;

                            if (sws->continuing) {
                                /*  This frame was empty, but continue
                                    next frame in fragmented sequence. */
                                nn_sws_recv_hdr (sws);
                                return;
                            }
                            else {
                                /*  Special case when there is no payload,
                                    mask, or additional frames. */
                                sws->instate = NN_SWS_INSTATE_RECVD_CHUNKED;
                                nn_pipebase_received (&sws->pipebase);
                                return;
                            }
                            }
                        /*  Continue to receive extended header+payload. */
                        break;

                    case NN_WS_OPCODE_FRAGMENT:

                        sws->is_control_frame = 0;
                        sws->continuing = !sws->is_final_frame;

                        if (sws->ext_hdr_len == 0 && sws->payload_ctl == 0) {
                            /*  Only a remote server could send a 2-byte msg;
                                sanity-check that this endpoint is a client. */
                            nn_assert (sws->mode == NN_WS_CLIENT);

                            sws->inmsg_current_chunk_len = 0;

                            if (sws->continuing) {
                                /*  This frame was empty, but continue
                                    next frame in fragmented sequence. */
                                nn_sws_recv_hdr (sws);
                                return;
                            }
                            else {
                                /*  Special case when there is no payload,
                                    mask, or additional frames. */
                                sws->instate = NN_SWS_INSTATE_RECVD_CHUNKED;
                                nn_pipebase_received (&sws->pipebase);
                                return;
                            }
                        }
                        /*  Continue to receive extended header+payload. */
                        break;

                    case NN_WS_OPCODE_PING:
                        sws->is_control_frame = 1;
                        sws->pings_received++;
                        if (sws->payload_ctl > NN_SWS_PAYLOAD_MAX_LENGTH) {
                            /*  As per RFC 6455 section 5.4, large payloads on
                                control frames is not allowed, and on receipt the
                                endpoint MUST close connection immediately. */
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Control frame payload exceeds allowable length.");
                            return;
                        }
                        if (!sws->is_final_frame) {
                            /*  As per RFC 6455 section 5.4, fragmentation of
                                control frames is not allowed; on receipt the
                                endpoint MUST close connection immediately. */
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Cannot fragment control message (FIN=0).");
                            return;
                        }

                        if (sws->ext_hdr_len == 0 && sws->payload_ctl == 0) {
                            /*  Special case when there is no payload,
                                mask, or additional frames. */
                            sws->inmsg_current_chunk_len = 0;
                            sws->instate = NN_SWS_INSTATE_RECVD_CONTROL;
                            nn_pipebase_received (&sws->pipebase);
                            return;
                        }
                        /*  Continue to receive extended header+payload. */
                        break;
                    
                    case NN_WS_OPCODE_PONG:
                        sws->is_control_frame = 1;
                        sws->pongs_received++;
                        if (sws->payload_ctl > NN_SWS_PAYLOAD_MAX_LENGTH) {
                            /*  As per RFC 6455 section 5.4, large payloads on
                                control frames is not allowed, and on receipt the
                                endpoint MUST close connection immediately. */
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Control frame payload exceeds allowable length.");
                            return;
                        }
                        if (!sws->is_final_frame) {
                            /*  As per RFC 6455 section 5.4, fragmentation of
                                control frames is not allowed; on receipt the
                                endpoint MUST close connection immediately. */
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Cannot fragment control message (FIN=0).");
                            return;
                        }

                        if (sws->ext_hdr_len == 0 && sws->payload_ctl == 0) {
                            /*  Special case when there is no payload,
                                mask, or additional frames. */
                            sws->inmsg_current_chunk_len = 0;
                            sws->instate = NN_SWS_INSTATE_RECVD_CONTROL;
                            nn_pipebase_received (&sws->pipebase);
                            return;
                        }
                        /*  Continue to receive extended header+payload. */
                        break;
                    
                    case NN_WS_OPCODE_CLOSE:
                        /*  RFC 6455 section 5.5.1. */
                        sws->is_control_frame = 1;
                        if (!sws->is_final_frame) {
                            /*  As per RFC 6455 section 5.4, fragmentation of
                                control frames is not allowed; on receipt the
                                endpoint MUST close connection immediately. */
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Cannot fragment control message (FIN=0).");
                            return;
                        }

                        if (sws->payload_ctl > NN_SWS_PAYLOAD_MAX_LENGTH) {
                            /*  As per RFC 6455 section 5.4, large payloads on
                                control frames is not allowed, and on receipt the
                                endpoint MUST close connection immediately. */
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Control frame payload exceeds allowable length.");
                            return;
                        }

                        if (sws->payload_ctl == 1) {
                            /*  As per RFC 6455 section 5.5.1, if a payload is
                                to accompany a close frame, the first two bytes
                                MUST be the close code. */
                            nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Expected 2byte close code.");
                            return;
                        }

                        if (sws->ext_hdr_len == 0 && sws->payload_ctl == 0) {
                            /*  Special case when there is no payload,
                                mask, or additional frames. */
                            sws->inmsg_current_chunk_len = 0;
                            sws->instate = NN_SWS_INSTATE_RECVD_CONTROL;
                            nn_pipebase_received (&sws->pipebase);
                            return;
                        }
                        /*  Continue to receive extended header+payload. */
                        break;
                    
                    default:
                        /*  Client sent an invalid opcode; as per RFC 6455
                            section 10.7, close connection with code. */
                        nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Invalid opcode.");
                        return;

                    }

                    if (sws->ext_hdr_len == 0) {
                        /*  Only a remote server could send a 2-byte msg;
                            sanity-check that this endpoint is a client. */
                        nn_assert (sws->mode == NN_WS_CLIENT);

                        /*  In the case of no additional header, the payload
                            is known to not exceed this threshold. */
                        nn_assert (sws->payload_ctl <= NN_SWS_PAYLOAD_MAX_LENGTH);

                        /*  In the case of no additional header, the payload
                            is known to not exceed this threshold. */
                        nn_assert (sws->payload_ctl > 0);

                        sws->instate = NN_SWS_INSTATE_RECV_PAYLOAD;
                        sws->inmsg_current_chunk_len = sws->payload_ctl;


                        /*  Use scatter/gather array for application messages,
                            and a fixed-width buffer for control messages. This
                            is convenient since control messages can be
                            interspersed between chunked application msgs. */
                        if (sws->is_control_frame) {
                            sws->inmsg_current_chunk_buf = sws->inmsg_control;
                        }
                        else {
                            sws->inmsg_chunks++;
                            sws->inmsg_total_size += sws->inmsg_current_chunk_len;
                            sws->inmsg_current_chunk_buf =
                                nn_msg_chunk_new (sws->inmsg_current_chunk_len,
                                &sws->inmsg_array);
                        }

                        nn_usock_recv (sws->usock, sws->inmsg_current_chunk_buf,
                            sws->inmsg_current_chunk_len, NULL);
                        return;
                    }
                    else {
                        /*  Continue receiving the rest of the header frame. */
                        sws->instate = NN_SWS_INSTATE_RECV_HDREXT;
                        nn_usock_recv (sws->usock,
                            sws->inhdr + NN_SWS_FRAME_SIZE_INITIAL,
                            sws->ext_hdr_len,
                            NULL);
                        return;
                    }

                case NN_SWS_INSTATE_RECV_HDREXT:
                    nn_assert (sws->ext_hdr_len > 0);

                    if (sws->payload_ctl <= NN_SWS_PAYLOAD_MAX_LENGTH) {
                        sws->inmsg_current_chunk_len = sws->payload_ctl;
                        if (sws->masked) {
                            sws->mask = sws->inhdr + NN_SWS_FRAME_SIZE_INITIAL;
                        }
                        else {
                            sws->mask = NULL;
                        }
                    }
                    else if (sws->payload_ctl == NN_SWS_PAYLOAD_FRAME_16) {
                        sws->inmsg_current_chunk_len =
                            nn_gets (sws->inhdr + NN_SWS_FRAME_SIZE_INITIAL);
                        if (sws->masked) {
                            sws->mask = sws->inhdr +
                                NN_SWS_FRAME_SIZE_INITIAL +
                                NN_SWS_FRAME_SIZE_PAYLOAD_16;
                        }
                        else {
                            sws->mask = NULL;
                        }
                    }
                    else if (sws->payload_ctl == NN_SWS_PAYLOAD_FRAME_63) {
                        sws->inmsg_current_chunk_len =
                            (size_t) nn_getll (sws->inhdr +
                            NN_SWS_FRAME_SIZE_INITIAL);
                        if (sws->masked) {
                            sws->mask = sws->inhdr +
                                NN_SWS_FRAME_SIZE_INITIAL +
                                NN_SWS_FRAME_SIZE_PAYLOAD_63;
                        }
                        else {
                            sws->mask = NULL;
                        }
                    }
                    else {
                        /*  Client sent invalid data; as per RFC 6455,
                            server closes the connection immediately. */
                        nn_sws_fail_conn (sws, NN_SWS_CLOSE_ERR_PROTO,
                                "Invalid payload length.");
                        return;
                    }

                    /*  Handle zero-length message bodies. */
                    if (sws->inmsg_current_chunk_len == 0)
                    {
                        if (sws->is_final_frame) {
                           if (sws->opcode == NN_WS_OPCODE_CLOSE) {
                             nn_pipebase_stop (&sws->pipebase);
                             sws->state = NN_SWS_STATE_CLOSING_CONNECTION;
                            }
                            else
                            { 
                              sws->instate = (sws->is_control_frame ?
                                  NN_SWS_INSTATE_RECVD_CONTROL :
                                  NN_SWS_INSTATE_RECVD_CHUNKED);
                              nn_pipebase_received (&sws->pipebase);
                            }
                        }
                        else {
                            nn_sws_recv_hdr (sws);
                        }
			return;
                    }

                    nn_assert (sws->inmsg_current_chunk_len > 0);

                    /*  Use scatter/gather array for application messages,
                        and a fixed-width buffer for control messages. This
                        is convenient since control messages can be
                        interspersed between chunked application msgs. */
                    if (sws->is_control_frame) {
                        sws->inmsg_current_chunk_buf = sws->inmsg_control;
                    }
                    else {
                        sws->inmsg_chunks++;
                        sws->inmsg_total_size += sws->inmsg_current_chunk_len;
                        sws->inmsg_current_chunk_buf =
                            nn_msg_chunk_new (sws->inmsg_current_chunk_len,
                            &sws->inmsg_array);
                    }

                    sws->instate = NN_SWS_INSTATE_RECV_PAYLOAD;
                    nn_usock_recv (sws->usock, sws->inmsg_current_chunk_buf,
                        sws->inmsg_current_chunk_len, NULL);
                    return;

                case NN_SWS_INSTATE_RECV_PAYLOAD:

                    /*  Unmask if necessary. */
                    if (sws->masked) {
                        nn_sws_mask_payload (sws->inmsg_current_chunk_buf,
                            sws->inmsg_current_chunk_len, sws->mask,
                            NN_SWS_FRAME_SIZE_MASK, NULL);
                    }

                    switch (sws->opcode) {

                    case NN_WS_OPCODE_TEXT:
                        nn_sws_validate_utf8_chunk (sws);
                        return;

                    case NN_WS_OPCODE_BINARY:
                        if (sws->is_final_frame) {
                            sws->instate = NN_SWS_INSTATE_RECVD_CHUNKED;
                            nn_pipebase_received (&sws->pipebase);
                        }
                        else {
                            nn_sws_recv_hdr (sws);
                        }
                        return;

                    case NN_WS_OPCODE_FRAGMENT:
                        /*  Must check original opcode to see if this fragment
                            needs UTF-8 validation. */
                        if ((sws->inmsg_hdr & NN_SWS_FRAME_BITMASK_OPCODE) ==
                            NN_WS_OPCODE_TEXT) {
                            nn_sws_validate_utf8_chunk (sws);
                        }
                        else if (sws->is_final_frame) {
                            sws->instate = NN_SWS_INSTATE_RECVD_CHUNKED;
                            nn_pipebase_received (&sws->pipebase);
                        }
                        else {
                            nn_sws_recv_hdr (sws);
                        }
                        return;

                    case NN_WS_OPCODE_PING:
                        sws->instate = NN_SWS_INSTATE_RECVD_CONTROL;
                        nn_pipebase_received (&sws->pipebase);
                        return;

                    case NN_WS_OPCODE_PONG:
                        sws->instate = NN_SWS_INSTATE_RECVD_CONTROL;
                        nn_pipebase_received (&sws->pipebase);
                        return;

                    case NN_WS_OPCODE_CLOSE:
                        /*  If the payload is not even long enough for the
                            required 2-octet Close Code, the connection
                            should have been failed upstream. */
                        nn_assert (sws->inmsg_current_chunk_len >=
                            NN_SWS_CLOSE_CODE_LEN);
                        
                        nn_pipebase_stop (&sws->pipebase);
                        sws->state = NN_SWS_STATE_CLOSING_CONNECTION;
                        return;

                    default:
                        /*  This should have been prevented upstream. */
                        nn_assert (0);
                        return;
                    } 

                default:
                    nn_fsm_error ("Unexpected socket instate",
                        sws->state, src, type);
                }

            case NN_USOCK_SHUTDOWN:
                nn_pipebase_stop (&sws->pipebase);
                sws->state = NN_SWS_STATE_BROKEN_CONNECTION;
                return;

            case NN_USOCK_ERROR:
                nn_pipebase_stop (&sws->pipebase);
                sws->state = NN_SWS_STATE_DONE;
                nn_fsm_raise (&sws->fsm, &sws->done, NN_SWS_RETURN_ERROR);
                return;

            default:
                nn_fsm_bad_action (sws->state, src, type);
            }

            break;

        default:
            nn_fsm_bad_source (sws->state, src, type);
        }

/******************************************************************************/
/*  CLOSING_CONNECTION state.                                                 */
/*  Wait for acknowledgement closing handshake was successfully sent.         */
/******************************************************************************/
    case NN_SWS_STATE_CLOSING_CONNECTION:
        switch (src) {

        case NN_SWS_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SENT:
                /*  Wait for acknowledgement closing handshake was sent
                    to peer. */
                nn_assert (sws->outstate == NN_SWS_OUTSTATE_SENDING);
                sws->outstate = NN_SWS_OUTSTATE_IDLE;
                sws->state = NN_SWS_STATE_DONE;
                nn_fsm_raise (&sws->fsm, &sws->done,
                    NN_SWS_RETURN_CLOSE_HANDSHAKE);
                return;
            case NN_USOCK_SHUTDOWN:
                return;
            case NN_USOCK_ERROR:
                sws->state = NN_SWS_STATE_DONE;
                nn_fsm_raise (&sws->fsm, &sws->done, NN_SWS_RETURN_ERROR);
                return;
            default:
                nn_fsm_bad_action (sws->state, src, type);
            }

        default:
            nn_fsm_bad_source (sws->state, src, type);
        }

/******************************************************************************/
/*  SHUTTING_DOWN state.                                                      */
/*  The underlying connection is closed. We are just waiting that underlying  */
/*  usock being closed                                                        */
/******************************************************************************/
    case NN_SWS_STATE_BROKEN_CONNECTION:
        switch (src) {

        case NN_SWS_SRC_USOCK:
            switch (type) {
            case NN_USOCK_ERROR:
                sws->state = NN_SWS_STATE_DONE;
                nn_fsm_raise (&sws->fsm, &sws->done, NN_SWS_RETURN_ERROR);
                return;
            default:
                nn_fsm_bad_action (sws->state, src, type);
            }

        default:
            nn_fsm_bad_source (sws->state, src, type);
        }

/******************************************************************************/
/*  DONE state.                                                               */
/*  The underlying connection is closed. There's nothing that can be done in  */
/*  this state except stopping the object.                                    */
/******************************************************************************/
    case NN_SWS_STATE_DONE:
        nn_fsm_bad_source (sws->state, src, type);

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (sws->state, src, type);
    }
}